

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeFunction<true,false,true,true>
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ArgSlot AVar2;
  int iVar3;
  JavascriptFunction *obj;
  Type *this;
  JavascriptLibrary *this_00;
  DynamicTypeHandler **ppDVar4;
  DynamicObject *pDVar5;
  FunctionInfo *this_01;
  FunctionProxy *this_02;
  ParseableFunctionInfo *this_03;
  Var pvVar6;
  ParseableFunctionInfo *funcInfo;
  DynamicObject *protoObject;
  ScriptFunction *pSStack_40;
  bool useAnonymous;
  ScriptFunction *scriptFunction;
  JavascriptLibrary *javascriptLibrary;
  JavascriptFunction *function;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *instance_local;
  
  obj = VarTo<Js::JavascriptFunction,Js::DynamicObject>(instance);
  this = RecyclableObject::GetType((RecyclableObject *)obj);
  this_00 = Js::Type::GetLibrary(this);
  pSStack_40 = (ScriptFunction *)0x0;
  protoObject._7_1_ = 0;
  bVar1 = VarIs<Js::ScriptFunction,Js::JavascriptFunction>(obj);
  if (bVar1) {
    pSStack_40 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    iVar3 = (*(pSStack_40->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x77])();
    protoObject._7_1_ = (byte)iVar3 & 1;
  }
  if (protoObject._7_1_ == 0) {
    ppDVar4 = Memory::WriteBarrierPtr::operator_cast_to_DynamicTypeHandler__
                        ((WriteBarrierPtr *)&this_00->functionWithPrototypeAndLengthTypeHandler);
    DeferredTypeHandlerBase::ConvertFunction(typeHandler,obj,*ppDVar4);
  }
  else {
    ppDVar4 = Memory::WriteBarrierPtr::operator_cast_to_DynamicTypeHandler__
                        ((WriteBarrierPtr *)&this_00->anonymousFunctionWithPrototypeTypeHandler);
    DeferredTypeHandlerBase::ConvertFunction(typeHandler,obj,*ppDVar4);
  }
  pDVar5 = CreateConstructorPrototypeObject(this_00,obj);
  if (pSStack_40 != (ScriptFunction *)0x0) {
    this_01 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)pSStack_40);
    bVar1 = FunctionInfo::IsClassConstructor(this_01);
    if (bVar1) {
      (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])(obj,0x124,pDVar5,0,0,0,0xf)
      ;
      goto LAB_011f579e;
    }
  }
  (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])(obj,0x124,pDVar5,0,0);
LAB_011f579e:
  if (pSStack_40 != (ScriptFunction *)0x0) {
    this_02 = ScriptFunction::GetFunctionProxy(pSStack_40);
    this_03 = FunctionProxy::EnsureDeserialized(this_02);
    AVar2 = ParseableFunctionInfo::GetReportedInParamsCount(this_03);
    pvVar6 = TaggedInt::ToVarUnchecked(AVar2 - 1);
    (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])(obj,0xd1,pvVar6,2,0,0,0);
    if (protoObject._7_1_ == 0) {
      ParseableFunctionInfo::GetIsStaticNameFunction(this_03);
    }
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptFunction * function = VarTo<JavascriptFunction>(instance);
        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        ScriptFunction *scriptFunction = nullptr;
        bool useAnonymous = false;
        if (VarIs<ScriptFunction>(function))
        {
            scriptFunction = Js::VarTo<Js::ScriptFunction>(function);
            useAnonymous = scriptFunction->IsAnonymousFunction();
        }

        if (!addPrototype)
        {
            if (!useAnonymous && addName)
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionTypeHandlerWithLength : javascriptLibrary->functionTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionTypeHandler);
            }
        }
        else
        {
            if (useAnonymous)
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionWithPrototypeAndLengthTypeHandler : javascriptLibrary->functionWithPrototypeTypeHandler);
            }
            DynamicObject *protoObject = javascriptLibrary->CreateConstructorPrototypeObject(function);
            if (scriptFunction && scriptFunction->GetFunctionInfo()->IsClassConstructor())
            {
                function->SetPropertyWithAttributes(PropertyIds::prototype, protoObject, PropertyNone, nullptr);
            }
            else
            {
                function->SetProperty(PropertyIds::prototype, protoObject, PropertyOperation_None, nullptr);
            }
        }

        if (scriptFunction)
        {
            ParseableFunctionInfo * funcInfo = scriptFunction->GetFunctionProxy()->EnsureDeserialized();

            CompileAssert(!addLength || useLengthType);
            if (addLength)
            {
                function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(funcInfo->GetReportedInParamsCount() - 1), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
            }

            if (useAnonymous || funcInfo->GetIsStaticNameFunction())
            {
                return true;
            }
        }

        if (addName)
        {
            JavascriptString * functionName = nullptr;
            if (((Js::JavascriptFunction*)function)->GetFunctionName(&functionName))
            {
                function->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return true;
    }